

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_ApproximateOffsetOfPlain::_Run(_Test_ApproximateOffsetOfPlain *this)

{
  Env **ppEVar1;
  pointer pcVar2;
  uint64_t uVar3;
  TableConstructor c;
  Options options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  KVMap kvmap;
  Slice local_2d0;
  TableConstructor local_2c0;
  Options local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  undefined1 local_200 [24];
  stringstream local_1e8 [392];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_2c0.super_Constructor.data_._M_t._M_impl.
  super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>._M_key_compare.cmp =
       (STLLessThan)BytewiseComparator();
  local_2c0.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c0.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2c0.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c0.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_2c0.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c0.super_Constructor._vptr_Constructor = (_func_int **)&PTR__TableConstructor_0013cdd0;
  local_2c0.source_ = (StringSource *)0x0;
  local_2c0.table_ = (Table *)0x0;
  pcVar2 = local_200 + 0x10;
  local_2c0.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c0.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"k01","");
  local_278.comparator = (Comparator *)0x129328;
  local_278.create_if_missing = true;
  local_278.error_if_exists = false;
  local_278.paranoid_checks = false;
  local_278._11_5_ = 0;
  Constructor::Add(&local_2c0.super_Constructor,(string *)local_200,(Slice *)&local_278);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"k02","");
  local_278.comparator = (Comparator *)0x129332;
  local_278.create_if_missing = true;
  local_278.error_if_exists = false;
  local_278.paranoid_checks = false;
  local_278._11_5_ = 0;
  Constructor::Add(&local_2c0.super_Constructor,(string *)local_200,(Slice *)&local_278);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"k03","");
  ppEVar1 = &local_278.env;
  local_278.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct((ulong)&local_278,'\x10');
  local_60._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)(STLLessThan)local_278.comparator;
  local_60._M_impl.super__Rb_tree_header._M_header._0_8_ = local_278._8_8_;
  Constructor::Add(&local_2c0.super_Constructor,(string *)local_200,(Slice *)&local_60);
  if (local_278.comparator != (Comparator *)ppEVar1) {
    operator_delete(local_278.comparator);
  }
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"k04","");
  local_278.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct((ulong)&local_278,'@');
  local_60._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)(STLLessThan)local_278.comparator;
  local_60._M_impl.super__Rb_tree_header._M_header._0_8_ = local_278._8_8_;
  Constructor::Add(&local_2c0.super_Constructor,(string *)local_200,(Slice *)&local_60);
  if (local_278.comparator != (Comparator *)ppEVar1) {
    operator_delete(local_278.comparator);
  }
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"k05","");
  local_278.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct((ulong)&local_278,-0x20);
  local_60._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)(STLLessThan)local_278.comparator;
  local_60._M_impl.super__Rb_tree_header._M_header._0_8_ = local_278._8_8_;
  Constructor::Add(&local_2c0.super_Constructor,(string *)local_200,(Slice *)&local_60);
  if (local_278.comparator != (Comparator *)ppEVar1) {
    operator_delete(local_278.comparator);
  }
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"k06","");
  local_278.comparator = (Comparator *)0x129349;
  local_278.create_if_missing = true;
  local_278.error_if_exists = false;
  local_278.paranoid_checks = false;
  local_278._11_5_ = 0;
  Constructor::Add(&local_2c0.super_Constructor,(string *)local_200,(Slice *)&local_278);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"k07","");
  local_278.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct((ulong)&local_278,-0x60);
  local_60._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)(STLLessThan)local_278.comparator;
  local_60._M_impl.super__Rb_tree_header._M_header._0_8_ = local_278._8_8_;
  Constructor::Add(&local_2c0.super_Constructor,(string *)local_200,(Slice *)&local_60);
  if (local_278.comparator != (Comparator *)ppEVar1) {
    operator_delete(local_278.comparator);
  }
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_);
  }
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)BytewiseComparator();
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_60._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  Options::Options(&local_278);
  local_278.block_size = 0x400;
  local_278.compression = kNoCompression;
  Constructor::Finish(&local_2c0.super_Constructor,&local_278,&local_218,(KVMap *)&local_60);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x30a;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "abc";
  local_2d0.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (uVar3 != 0) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,0,0);
  }
  test::Tester::Is((Tester *)local_200,uVar3 == 0,"Between(c.ApproximateOffsetOf(\"abc\"), 0, 0)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x30b;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "k01";
  local_2d0.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (uVar3 != 0) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,0,0);
  }
  test::Tester::Is((Tester *)local_200,uVar3 == 0,"Between(c.ApproximateOffsetOf(\"k01\"), 0, 0)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x30c;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "k01a";
  local_2d0.size_ = 4;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (uVar3 != 0) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,0,0);
  }
  test::Tester::Is((Tester *)local_200,uVar3 == 0,"Between(c.ApproximateOffsetOf(\"k01a\"), 0, 0)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x30d;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "k02";
  local_2d0.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (uVar3 != 0) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,0,0);
  }
  test::Tester::Is((Tester *)local_200,uVar3 == 0,"Between(c.ApproximateOffsetOf(\"k02\"), 0, 0)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x30e;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "k03";
  local_2d0.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (uVar3 != 0) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,0,0);
  }
  test::Tester::Is((Tester *)local_200,uVar3 == 0,"Between(c.ApproximateOffsetOf(\"k03\"), 0, 0)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x30f;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "k04";
  local_2d0.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (1000 < uVar3 - 10000) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,10000,11000);
  }
  test::Tester::Is((Tester *)local_200,uVar3 - 10000 < 0x3e9,
                   "Between(c.ApproximateOffsetOf(\"k04\"), 10000, 11000)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x310;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "k04a";
  local_2d0.size_ = 4;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (1000 < uVar3 - 210000) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,210000,0x33838);
  }
  test::Tester::Is((Tester *)local_200,uVar3 - 210000 < 0x3e9,
                   "Between(c.ApproximateOffsetOf(\"k04a\"), 210000, 211000)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x311;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "k05";
  local_2d0.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (1000 < uVar3 - 210000) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,210000,0x33838);
  }
  test::Tester::Is((Tester *)local_200,uVar3 - 210000 < 0x3e9,
                   "Between(c.ApproximateOffsetOf(\"k05\"), 210000, 211000)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x312;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "k06";
  local_2d0.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (1000 < uVar3 - 510000) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,510000,0x7cc18);
  }
  test::Tester::Is((Tester *)local_200,uVar3 - 510000 < 0x3e9,
                   "Between(c.ApproximateOffsetOf(\"k06\"), 510000, 511000)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x313;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "k07";
  local_2d0.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (1000 < uVar3 - 510000) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,510000,0x7cc18);
  }
  test::Tester::Is((Tester *)local_200,uVar3 - 510000 < 0x3e9,
                   "Between(c.ApproximateOffsetOf(\"k07\"), 510000, 511000)");
  test::Tester::~Tester((Tester *)local_200);
  local_200[0] = 1;
  local_200._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_200._16_4_ = 0x314;
  std::__cxx11::stringstream::stringstream(local_1e8);
  local_2d0.data_ = "xyz";
  local_2d0.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(local_2c0.table_,&local_2d0);
  if (2000 < uVar3 - 610000) {
    fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",uVar3,610000,0x956a0);
  }
  test::Tester::Is((Tester *)local_200,uVar3 - 610000 < 0x7d1,
                   "Between(c.ApproximateOffsetOf(\"xyz\"), 610000, 612000)");
  test::Tester::~Tester((Tester *)local_200);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  local_2c0.super_Constructor._vptr_Constructor = (_func_int **)&PTR__TableConstructor_0013cdd0;
  TableConstructor::Reset(&local_2c0);
  local_2c0.super_Constructor._vptr_Constructor = (_func_int **)&PTR__Constructor_0013cc78;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase(&local_2c0.super_Constructor.data_._M_t,
             (_Link_type)
             local_2c0.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent);
  return;
}

Assistant:

TEST(TableTest, ApproximateOffsetOfPlain) {
  TableConstructor c(BytewiseComparator());
  c.Add("k01", "hello");
  c.Add("k02", "hello2");
  c.Add("k03", std::string(10000, 'x'));
  c.Add("k04", std::string(200000, 'x'));
  c.Add("k05", std::string(300000, 'x'));
  c.Add("k06", "hello3");
  c.Add("k07", std::string(100000, 'x'));
  std::vector<std::string> keys;
  KVMap kvmap;
  Options options;
  options.block_size = 1024;
  options.compression = kNoCompression;
  c.Finish(options, &keys, &kvmap);

  ASSERT_TRUE(Between(c.ApproximateOffsetOf("abc"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k01"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k01a"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k02"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k03"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k04"), 10000, 11000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k04a"), 210000, 211000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k05"), 210000, 211000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k06"), 510000, 511000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k07"), 510000, 511000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("xyz"), 610000, 612000));
}